

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Read>>>::
emplace<std::_Rb_tree_const_iterator<Node<Read>>const&>
          (QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Read>>> *this,qsizetype i,
          _Rb_tree_const_iterator<Node<Read>_> *args)

{
  long lVar1;
  _Base_ptr p_Var2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  Inserter local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this == (int *)0x0) || (1 < **(int **)this)) {
LAB_0011148c:
    p_Var2 = args->_M_node;
    lVar1 = *(long *)(this + 0x10);
    QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_>::detachAndGrow
              ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_> *)this,
               (uint)(i == 0 && lVar1 != 0),1,(_Rb_tree_const_iterator<Node<Read>_> **)0x0,
               (QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_> *)0x0);
    if (i != 0 || lVar1 == 0) {
      QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Read>_>_>::Inserter::Inserter
                (&local_58,(QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_> *)this,i,1
                );
      (local_58.displaceFrom)->_M_node = p_Var2;
      (local_58.data)->size = (local_58.data)->size + local_58.nInserts;
      goto LAB_001114f3;
    }
    *(_Base_ptr *)(*(long *)(this + 8) + -8) = p_Var2;
  }
  else {
    if (*(long *)(this + 0x10) == i) {
      qVar3 = QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_> *)this);
      if (qVar3 != 0) {
        lVar1 = *(long *)(this + 0x10);
        *(_Base_ptr *)(*(long *)(this + 8) + lVar1 * 8) = args->_M_node;
        *(long *)(this + 0x10) = lVar1 + 1;
        goto LAB_001114f3;
      }
    }
    if (i != 0) goto LAB_0011148c;
    qVar3 = QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_>::freeSpaceAtBegin
                      ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_> *)this);
    if (qVar3 == 0) goto LAB_0011148c;
    *(_Base_ptr *)(*(long *)(this + 8) + -8) = args->_M_node;
  }
  *(long *)(this + 8) = *(long *)(this + 8) + -8;
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
LAB_001114f3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }